

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O2

void __thiscall pg::TLSolver::attractVertices(TLSolver *this,int pl,int v,bitset *R,bitset *Z)

{
  uint vertex;
  Game *pGVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  char *pcVar8;
  int *piVar9;
  ulong uVar10;
  int from;
  ulong uVar11;
  ulong uVar12;
  _label_vertex local_48;
  bitset *local_38;
  
  pGVar1 = (this->super_Solver).game;
  puVar7 = (uint *)(pGVar1->_inedges + pGVar1->_firstins[v]);
  local_38 = R;
  do {
    vertex = *puVar7;
    uVar11 = (ulong)(int)vertex;
    if (uVar11 == 0xffffffffffffffff) {
      return;
    }
    uVar12 = uVar11 >> 6;
    if ((Z->_bits[uVar12] >> (uVar11 & 0x3f) & 1) == 0) {
      uVar6 = 1L << (uVar11 & 0x3f);
      if ((local_38->_bits[uVar12] & uVar6) != 0) {
        iVar2 = Solver::owner(&this->super_Solver,vertex);
        if (iVar2 != pl) {
          uVar5 = this->escs[uVar11];
          if (uVar5 == 0) {
            pGVar1 = (this->super_Solver).game;
            uVar5 = 0;
            for (piVar9 = pGVar1->_outedges + pGVar1->_firstouts[uVar11]; uVar10 = (ulong)*piVar9,
                uVar10 != 0xffffffffffffffff; piVar9 = piVar9 + 1) {
              uVar5 = uVar5 + (((this->G)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0);
            }
          }
          this->escs[uVar11] = uVar5 - 1;
          if (uVar5 - 1 != 0) goto LAB_0016536b;
        }
        Z->_bits[uVar12] = Z->_bits[uVar12] | uVar6;
        iVar3 = Solver::owner(&this->super_Solver,vertex);
        iVar2 = -1;
        if (iVar3 == pl) {
          iVar2 = v;
        }
        this->str[uVar11] = iVar2;
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        (this->Q).queue[iVar2] = vertex;
        if (2 < (this->super_Solver).trace) {
          poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          local_48.g = (this->super_Solver).game;
          local_48.v = vertex;
          poVar4 = operator<<(poVar4,&local_48);
          poVar4 = std::operator<<(poVar4,"\x1b[m by \x1b[1;36m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pl);
          std::operator<<(poVar4,"\x1b[m");
          iVar2 = Solver::owner(&this->super_Solver,vertex);
          poVar4 = (this->super_Solver).logger;
          if (iVar2 == pl) {
            poVar4 = std::operator<<(poVar4," (via ");
            local_48.g = (this->super_Solver).game;
            local_48.v = v;
            poVar4 = operator<<(poVar4,&local_48);
            pcVar8 = ")";
          }
          else {
            pcVar8 = " (forced)";
          }
          poVar4 = std::operator<<(poVar4,pcVar8);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
    }
    else {
      iVar2 = Solver::owner(&this->super_Solver,vertex);
      if ((iVar2 == pl) && (this->str[uVar11] == -1)) {
        this->str[uVar11] = v;
      }
    }
LAB_0016536b:
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void
TLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from]) {
            if (owner(from) != pl) {
                // check if opponent can escape
                unsigned int e = escs[from];
                if (e == 0) {
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        if (G[*curedge]) e++;
                    }
                }
                escs[from] = --e;
                if (e > 0) continue; // escapes
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}